

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

int nn_xrep_create(void *hint,nn_sockbase **sockbase)

{
  nn_xrep *self;
  
  self = (nn_xrep *)nn_alloc_(0x1b0);
  if (self != (nn_xrep *)0x0) {
    nn_xrep_init(self,&nn_xrep_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_xrep_create_cold_1();
}

Assistant:

static int nn_xrep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xrep *self;

    self = nn_alloc (sizeof (struct nn_xrep), "socket (xrep)");
    alloc_assert (self);
    nn_xrep_init (self, &nn_xrep_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}